

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

void duckdb::DateTruncFunction<duckdb::timestamp_t,duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  byte bVar1;
  reference left;
  reference right;
  NotImplementedException *this;
  allocator local_49;
  string local_48;
  
  left = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  right = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  if (*left != (value_type)0x2) {
    BinaryExecutor::
    ExecuteStandard<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t,duckdb::DateTruncBinaryOperator>
              (left,right,result,*(idx_t *)(args + 0x18));
    return;
  }
  if ((*(byte **)(left + 0x28) != (byte *)0x0) && ((**(byte **)(left + 0x28) & 1) == 0)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  string_t::GetString_abi_cxx11_(&local_48,*(string_t **)(left + 0x20));
  bVar1 = duckdb::GetDatePartSpecifier((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1 < 0x18) {
    count = *(idx_t *)(args + 0x18);
    switch(bVar1) {
    case 0:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::YearOperator>
                (right,result,count);
      break;
    case 1:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::MonthOperator>
                (right,result,count);
      break;
    default:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::DayOperator>
                (right,result,count);
      break;
    case 3:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::DecadeOperator>
                (right,result,count);
      break;
    case 4:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::CenturyOperator>
                (right,result,count);
      break;
    case 5:
      DateTrunc::
      UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::MillenniumOperator>
                (right,result,count);
      break;
    case 6:
      DateTrunc::
      UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::MicrosecondOperator>
                (right,result,count);
      break;
    case 7:
      DateTrunc::
      UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::MillisecondOperator>
                (right,result,count);
      break;
    case 8:
    case 0x16:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::SecondOperator>
                (right,result,count);
      break;
    case 9:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::MinuteOperator>
                (right,result,count);
      break;
    case 10:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::HourOperator>
                (right,result,count);
      break;
    case 0xd:
    case 0x11:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::WeekOperator>
                (right,result,count);
      break;
    case 0xe:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::ISOYearOperator>
                (right,result,count);
      break;
    case 0xf:
      DateTrunc::UnaryExecute<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::QuarterOperator>
                (right,result,count);
      break;
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
      goto switchD_00692ff5_caseD_12;
    }
    return;
  }
switchD_00692ff5_caseD_12:
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_48,"Specifier type not implemented for DATETRUNC",&local_49);
  duckdb::NotImplementedException::NotImplementedException(this,(string *)&local_48);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void DateTruncFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &part_arg = args.data[0];
	auto &date_arg = args.data[1];

	if (part_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// Common case of constant part.
		if (ConstantVector::IsNull(part_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			const auto type = GetDatePartSpecifier(ConstantVector::GetData<string_t>(part_arg)->GetString());
			DateTruncUnaryExecutor<TA, TR>(type, date_arg, result, args.size());
		}
	} else {
		BinaryExecutor::ExecuteStandard<string_t, TA, TR, DateTruncBinaryOperator>(part_arg, date_arg, result,
		                                                                           args.size());
	}
}